

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

void google::protobuf::internal::SingularFieldHelper<8>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  uint8_t uVar1;
  uint8_t *ptr;
  uint32_t local_1c;
  
  local_1c = md->tag;
  PrimitiveTypeHelper<13>::Serialize(&local_1c,output);
  uVar1 = *field;
  ptr = output->cur_;
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  *ptr = uVar1;
  output->cur_ = ptr + 1;
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }